

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib568.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long local_e0;
  curl_slist *custom_headers;
  char *pcStack_d0;
  int request;
  char *stream_uri;
  stat file_info;
  FILE *sdpf;
  int sdp;
  CURL *curl;
  int res;
  char *URL_local;
  
  file_info.__glibc_reserved[2] = 0;
  pcStack_d0 = (char *)0x0;
  local_e0 = 0;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      fprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      curl._4_4_ = curl_easy_setopt(lVar2,0x272d,_stdout);
      if (((curl._4_4_ == 0) &&
          (curl._4_4_ = curl_easy_setopt(lVar2,0x2711,_stdout), curl._4_4_ == 0)) &&
         (curl._4_4_ = curl_easy_setopt(lVar2,0x2712,URL), curl._4_4_ == 0)) {
        pcStack_d0 = suburl(URL,1);
        if (pcStack_d0 == (char *)0x0) {
          curl._4_4_ = 0x7e;
        }
        else {
          curl._4_4_ = curl_easy_setopt(lVar2,0x27cf,pcStack_d0);
          if (curl._4_4_ == 0) {
            free(pcStack_d0);
            pcStack_d0 = (char *)0x0;
            iVar1 = open64("log/file568.txt",0);
            fstat64(iVar1,(stat64 *)&stream_uri);
            close(iVar1);
            file_info.__glibc_reserved[2] = (__syscall_slong_t)fopen64("log/file568.txt","rb");
            if ((FILE *)file_info.__glibc_reserved[2] == (FILE *)0x0) {
              fprintf(_stderr,"can\'t open log/file568.txt\n");
              curl._4_4_ = 0x7e;
            }
            else {
              curl._4_4_ = curl_easy_setopt(lVar2,0xbd,3);
              if ((((curl._4_4_ == 0) &&
                   (curl._4_4_ = curl_easy_setopt(lVar2,0x2719,file_info.__glibc_reserved[2]),
                   curl._4_4_ == 0)) &&
                  ((curl._4_4_ = curl_easy_setopt(lVar2,0x2e,1), curl._4_4_ == 0 &&
                   ((curl._4_4_ = curl_easy_setopt(lVar2,0x75a3,file_info.st_rdev), curl._4_4_ == 0
                    && (curl._4_4_ = curl_easy_perform(lVar2), curl._4_4_ == 0)))))) &&
                 (curl._4_4_ = curl_easy_setopt(lVar2,0x2e,0), curl._4_4_ == 0)) {
                fclose((FILE *)file_info.__glibc_reserved[2]);
                file_info.__glibc_reserved[2] = 0;
                pcStack_d0 = suburl(URL,2);
                if (pcStack_d0 == (char *)0x0) {
                  curl._4_4_ = 0x7e;
                }
                else {
                  curl._4_4_ = curl_easy_setopt(lVar2,0x27cf,pcStack_d0);
                  if (curl._4_4_ == 0) {
                    free(pcStack_d0);
                    pcStack_d0 = (char *)0x0;
                    curl._4_4_ = curl_easy_setopt(lVar2,0xbd,2);
                    if ((curl._4_4_ == 0) &&
                       (curl._4_4_ = curl_easy_perform(lVar2), curl._4_4_ == 0)) {
                      pcStack_d0 = suburl(URL,3);
                      if (pcStack_d0 == (char *)0x0) {
                        curl._4_4_ = 0x7e;
                      }
                      else {
                        curl._4_4_ = curl_easy_setopt(lVar2,0x27cf,pcStack_d0);
                        if (curl._4_4_ == 0) {
                          free(pcStack_d0);
                          pcStack_d0 = (char *)0x0;
                          local_e0 = curl_slist_append(0,"Content-Type: posty goodness");
                          if (local_e0 == 0) {
                            curl._4_4_ = 0x7e;
                          }
                          else {
                            curl._4_4_ = curl_easy_setopt(lVar2,0x2727,local_e0);
                            if (((((curl._4_4_ == 0) &&
                                  (curl._4_4_ = curl_easy_setopt(lVar2,0xbd,3), curl._4_4_ == 0)) &&
                                 (curl._4_4_ = curl_easy_setopt(lVar2,0x271f,
                                                                                                                                
                                                  "postyfield=postystuff&project=curl\n"),
                                 curl._4_4_ == 0)) &&
                                ((curl._4_4_ = curl_easy_perform(lVar2), curl._4_4_ == 0 &&
                                 (curl._4_4_ = curl_easy_setopt(lVar2,0x271f,0), curl._4_4_ == 0))))
                               && (curl._4_4_ = curl_easy_setopt(lVar2,0x2727,0), curl._4_4_ == 0))
                            {
                              curl_slist_free_all(local_e0);
                              local_e0 = 0;
                              pcStack_d0 = suburl(URL,4);
                              if (pcStack_d0 == (char *)0x0) {
                                curl._4_4_ = 0x7e;
                              }
                              else {
                                curl._4_4_ = curl_easy_setopt(lVar2,0x27cf,pcStack_d0);
                                if (curl._4_4_ == 0) {
                                  free(pcStack_d0);
                                  pcStack_d0 = (char *)0x0;
                                  curl._4_4_ = curl_easy_setopt(lVar2,0xbd,1);
                                  if (curl._4_4_ == 0) {
                                    curl._4_4_ = curl_easy_perform(lVar2);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (file_info.__glibc_reserved[2] != 0) {
        fclose((FILE *)file_info.__glibc_reserved[2]);
      }
      if (pcStack_d0 != (char *)0x0) {
        free(pcStack_d0);
      }
      if (local_e0 != 0) {
        curl_slist_free_all(local_e0);
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      URL_local._4_4_ = curl._4_4_;
    }
  }
  else {
    fprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res;
  CURL *curl;
  int sdp;
  FILE *sdpf = NULL;
  struct_stat file_info;
  char *stream_uri = NULL;
  int request=1;
  struct curl_slist *custom_headers=NULL;

  if (curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  if ((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_HEADERDATA, stdout);
  test_setopt(curl, CURLOPT_WRITEDATA, stdout);

  test_setopt(curl, CURLOPT_URL, URL);

  if((stream_uri = suburl(URL, request++)) == NULL) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  sdp = open("log/file568.txt", O_RDONLY);
  fstat(sdp, &file_info);
  close(sdp);

  sdpf = fopen("log/file568.txt", "rb");
  if(sdpf == NULL) {
    fprintf(stderr, "can't open log/file568.txt\n");
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_ANNOUNCE);

  test_setopt(curl, CURLOPT_READDATA, sdpf);
  test_setopt(curl, CURLOPT_UPLOAD, 1L);
  test_setopt(curl, CURLOPT_INFILESIZE_LARGE, (curl_off_t) file_info.st_size);

  /* Do the ANNOUNCE */
  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  test_setopt(curl, CURLOPT_UPLOAD, 0L);
  fclose(sdpf);
  sdpf = NULL;

  /* Make sure we can do a normal request now */
  if((stream_uri = suburl(URL, request++)) == NULL) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_DESCRIBE);
  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  /* Now do a POST style one */

  if((stream_uri = suburl(URL, request++)) == NULL) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  custom_headers = curl_slist_append(custom_headers,
                                     "Content-Type: posty goodness");
  if(!custom_headers) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSPHEADER, custom_headers);
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_ANNOUNCE);
  test_setopt(curl, CURLOPT_POSTFIELDS, "postyfield=postystuff&project=curl\n");

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  test_setopt(curl, CURLOPT_POSTFIELDS, NULL);
  test_setopt(curl, CURLOPT_RTSPHEADER, NULL);
  curl_slist_free_all(custom_headers);
  custom_headers = NULL;

  /* Make sure we can do a normal request now */
  if((stream_uri = suburl(URL, request++)) == NULL) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_OPTIONS);
  res = curl_easy_perform(curl);

test_cleanup:

  if(sdpf)
    fclose(sdpf);

  if(stream_uri)
    free(stream_uri);

  if(custom_headers)
    curl_slist_free_all(custom_headers);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}